

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_cache_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::NameCacheTests_test_last_id_Test::~NameCacheTests_test_last_id_Test
          (NameCacheTests_test_last_id_Test *this)

{
  (this->super_NameCacheTests).super_Test._vptr_Test = (_func_int **)&PTR__NameCacheTests_0029daa8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<int>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<int>_>_>_>
               *)&(this->super_NameCacheTests).name_cache_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x68);
  return;
}

Assistant:

TEST_F(NameCacheTests, test_last_id)
{
    EXPECT_EQ(0, name_cache_.LastID("Test"));
    EXPECT_EQ(0, name_cache_.LastID("Test"));
    EXPECT_EQ(1, name_cache_.NextID("Test"));
    EXPECT_EQ(2, name_cache_.NextID("Test"));
    EXPECT_EQ(2, name_cache_.LastID("Test"));
    EXPECT_EQ(2, name_cache_.LastID("Test"));
    EXPECT_EQ(0, name_cache_.LastID("Test2"));
    EXPECT_EQ(0, name_cache_.LastID("Test2"));
}